

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *data)

{
  void *pvVar1;
  xmlOutputWriteCallback p_Var2;
  int iVar3;
  uint uVar4;
  xmlBufPtr pxVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  ulong uVar8;
  ulong local_38;
  
  if (out == (xmlOutputBufferPtr)0x0) {
    return -1;
  }
  if (out->error != 0) {
    return -1;
  }
  if (len < 0) {
    return 0;
  }
  local_38 = (ulong)(uint)len;
  iVar3 = xmlBufAdd(out->buffer,(xmlChar *)data,local_38);
  if (iVar3 != 0) {
LAB_0015d1ed:
    out->error = 2;
    return -1;
  }
  if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
    if (out->writecallback != (xmlOutputWriteCallback)0x0) {
      pxVar5 = out->buffer;
      goto LAB_0015d259;
    }
  }
  else {
    if (out->conv == (xmlBufPtr)0x0) {
      pxVar5 = xmlBufCreate(4000);
      out->conv = pxVar5;
      if (pxVar5 == (xmlBufPtr)0x0) goto LAB_0015d1ed;
    }
    sVar6 = xmlBufUse(out->buffer);
    uVar4 = 0;
    if ((0xff < sVar6) && (uVar4 = xmlCharEncOutput(out,0), (int)uVar4 < 0)) {
      return -1;
    }
    if (out->writecallback != (xmlOutputWriteCallback)0x0) {
      pxVar5 = out->conv;
LAB_0015d259:
      local_38 = 0;
      goto LAB_0015d272;
    }
    local_38 = (ulong)uVar4;
  }
  pxVar5 = (xmlBufPtr)0x0;
LAB_0015d272:
  if ((pxVar5 != (xmlBufPtr)0x0) && (out->writecallback != (xmlOutputWriteCallback)0x0)) {
    do {
      sVar6 = xmlBufUse(pxVar5);
      iVar3 = 3;
      if (3999 < sVar6) {
        pvVar1 = out->context;
        p_Var2 = out->writecallback;
        pxVar7 = xmlBufContent(pxVar5);
        uVar4 = (*p_Var2)(pvVar1,(char *)pxVar7,(int)sVar6);
        if ((int)uVar4 < 0) {
          iVar3 = -uVar4;
          if (uVar4 == 0xffffffff) {
            iVar3 = 0x60a;
          }
          out->error = iVar3;
        }
        else {
          if ((uVar4 != 0) && (uVar8 = (ulong)uVar4, uVar8 <= sVar6)) {
            xmlBufShrink(pxVar5,uVar8);
            local_38 = local_38 + uVar8;
            iVar3 = out->written + uVar4;
            if ((int)(uVar4 ^ 0x7fffffff) < out->written) {
              iVar3 = 0x7fffffff;
            }
            out->written = iVar3;
            iVar3 = 0;
            goto LAB_0015d2ee;
          }
          out->error = 1;
        }
        iVar3 = 1;
      }
LAB_0015d2ee:
    } while (iVar3 == 0);
    if (iVar3 != 3) {
      return -1;
    }
  }
  uVar8 = 0x7fffffff;
  if (local_38 < 0x7fffffff) {
    uVar8 = local_38;
  }
  return (int)uVar8;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *data) {
    xmlBufPtr buf = NULL;
    size_t written = 0;
    int ret;

    if ((out == NULL) || (out->error))
        return(-1);
    if (len < 0)
        return(0);

    ret = xmlBufAdd(out->buffer, (const xmlChar *) data, len);
    if (ret != 0) {
        out->error = XML_ERR_NO_MEMORY;
        return(-1);
    }

    /*
     * first handle encoding stuff.
     */
    if (out->encoder != NULL) {
        /*
         * Store the data in the incoming raw buffer
         */
        if (out->conv == NULL) {
            out->conv = xmlBufCreate(MINLEN);
            if (out->conv == NULL) {
                out->error = XML_ERR_NO_MEMORY;
                return(-1);
            }
        }

        /*
         * convert as much as possible to the parser reading buffer.
         */
        if (xmlBufUse(out->buffer) < 256) {
            ret = 0;
        } else {
            ret = xmlCharEncOutput(out, 0);
            if (ret < 0)
                return(-1);
        }

        if (out->writecallback)
            buf = out->conv;
        else
            written = ret;
    } else {
        if (out->writecallback)
            buf = out->buffer;
        else
            written = len;
    }

    if ((buf != NULL) && (out->writecallback)) {
        /*
         * second write the stuff to the I/O channel
         */
        while (1) {
            size_t nbchars = xmlBufUse(buf);

            if (nbchars < MINLEN)
                break;

            ret = out->writecallback(out->context,
                       (const char *)xmlBufContent(buf), nbchars);
            if (ret < 0) {
                out->error = (ret == -1) ? XML_IO_WRITE : -ret;
                return(-1);
            }
            if ((ret == 0) || ((size_t) ret > nbchars)) {
                out->error = XML_ERR_INTERNAL_ERROR;
                return(-1);
            }

            xmlBufShrink(buf, ret);
            written += ret;
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
        }
    }

    return(written <= INT_MAX ? written : INT_MAX);
}